

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O0

uint32_t c_u32_load_unaligned(void *p)

{
  int c;
  uint8_t *q;
  uint8_t *pp;
  uint32_t t;
  void *p_local;
  
  for (c = 0; c < 4; c = c + 1) {
    *(undefined1 *)((long)&t + (long)c) = *(undefined1 *)((long)p + (long)c);
  }
  return t;
}

Assistant:

SIMD_INLINE uint32_t c_u32_load_unaligned(const void *p) {
  uint32_t t;
  uint8_t *pp = (uint8_t *)p;
  uint8_t *q = (uint8_t *)&t;
  int c;
  for (c = 0; c < 4; c++) q[c] = pp[c];
  return t;
}